

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmFunction *function)

{
  SmallArray<VmValue_*,_4U> *this;
  VmInstructionType VVar1;
  VmValue *pVVar2;
  VmBlock *curr;
  VmBlock *pVVar3;
  VmValue **ppVVar4;
  VmBlock **ppVVar5;
  VmBlock *pVVar6;
  uint i;
  uint uVar7;
  VmInstruction *inst;
  VmBlock **ppVVar8;
  VmBlock *local_60;
  VmBlock *local_58;
  VmBlock **local_50;
  VmBlock *local_48;
  ExpressionContext *local_40;
  SmallArray<VmValue_*,_8U> *local_38;
  
  local_60 = function->firstBlock;
  if (local_60 != (VmBlock *)0x0) {
    ppVVar8 = &function->firstBlock;
    for (pVVar3 = local_60; pVVar3 != (VmBlock *)0x0; pVVar3 = pVVar3->nextSibling) {
      (pVVar3->predecessors).count = 0;
      (pVVar3->successors).count = 0;
    }
    local_40 = ctx;
    for (; ppVVar5 = ppVVar8, local_60 != (VmBlock *)0x0; local_60 = local_60->nextSibling) {
      for (uVar7 = 0; uVar7 < (local_60->super_VmValue).users.count; uVar7 = uVar7 + 1) {
        ppVVar4 = SmallArray<VmValue_*,_8U>::operator[](&(local_60->super_VmValue).users,uVar7);
        pVVar2 = *ppVVar4;
        if (((pVVar2 != (VmValue *)0x0) && (pVVar2->typeID == 2)) &&
           (*(int *)&pVVar2[1]._vptr_VmValue != 0x4d)) {
          SmallArray<VmBlock_*,_4U>::push_back(&local_60->predecessors,(VmBlock **)&pVVar2[1].users)
          ;
          SmallArray<VmBlock_*,_4U>::push_back
                    ((SmallArray<VmBlock_*,_4U> *)(pVVar2[1].users.data + 0x24),&local_60);
        }
      }
    }
    while (pVVar3 = *ppVVar5, pVVar3 != (VmBlock *)0x0) {
      pVVar3->visited = false;
      ppVVar5 = &pVVar3->nextSibling;
    }
    MarkReachableBlocks(*ppVVar8);
    pVVar3 = (*ppVVar8)->nextSibling;
    local_50 = ppVVar8;
    while (pVVar6 = pVVar3, pVVar6 != (VmBlock *)0x0) {
      pVVar3 = pVVar6->nextSibling;
      if (pVVar6->visited == false) {
        local_38 = &(pVVar6->super_VmValue).users;
        local_58 = pVVar6;
        local_48 = pVVar6->nextSibling;
LAB_00254e2d:
        pVVar6 = local_58;
        pVVar3 = local_48;
        ppVVar8 = local_50;
        if ((local_58->super_VmValue).users.count != 0) {
          ppVVar4 = SmallArray<VmValue_*,_8U>::back(local_38);
          inst = (VmInstruction *)*ppVVar4;
          if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
            inst = (VmInstruction *)0x0;
          }
          VVar1 = inst->cmd;
          if (VVar1 - VM_INST_JUMP_Z < 2) {
            uVar7 = 1;
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,1);
            if ((VmBlock *)*ppVVar4 == pVVar6) {
              uVar7 = 2;
            }
            ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,uVar7);
            anon_unknown.dwarf_20a43d::ChangeInstructionTo
                      (module,inst,VM_INST_JUMP,*ppVVar4,(VmValue *)0x0,(VmValue *)0x0,
                       (VmValue *)0x0,(VmValue *)0x0,(uint *)0x0);
          }
          else if (VVar1 == VM_INST_JUMP) {
            VmBlock::RemoveInstruction(inst->parent,inst);
          }
          else if (VVar1 == VM_INST_PHI) {
            this = &inst->arguments;
            for (uVar7 = 0; uVar7 < (inst->arguments).count; uVar7 = uVar7 + 2) {
              ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar7);
              pVVar2 = *ppVVar4;
              ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar7 + 1);
              pVVar3 = (VmBlock *)*ppVVar4;
              if (pVVar3 == local_58) {
                VmValue::RemoveUse(pVVar2,&inst->super_VmValue);
                VmValue::RemoveUse((VmValue *)pVVar3,&inst->super_VmValue);
                ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,(inst->arguments).count - 2);
                pVVar2 = *ppVVar4;
                ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar7);
                *ppVVar4 = pVVar2;
                ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,(inst->arguments).count - 1);
                pVVar2 = *ppVVar4;
                ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,uVar7 + 1);
                *ppVVar4 = pVVar2;
                SmallArray<VmValue_*,_4U>::pop_back(this);
                SmallArray<VmValue_*,_4U>::pop_back(this);
                break;
              }
            }
          }
          goto LAB_00254e2d;
        }
      }
    }
    pVVar3 = *ppVVar8;
    while (pVVar3 != (VmBlock *)0x0) {
      pVVar6 = pVVar3->nextSibling;
      RunDeadCodeElimiation(local_40,module,pVVar3);
      pVVar3 = pVVar6;
    }
    while (pVVar3 = *ppVVar8, pVVar3 != (VmBlock *)0x0) {
      if (pVVar3->visited == false) {
        __assert_fail("curr->visited",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1352,
                      "void RunDeadCodeElimiation(ExpressionContext &, VmModule *, VmFunction *)");
      }
      pVVar3->visited = false;
      ppVVar8 = &pVVar3->nextSibling;
    }
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmFunction* function)
{
	if(!function->firstBlock)
		return;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		curr->predecessors.clear();
		curr->successors.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	MarkReachableBlocks(function->firstBlock);

	// Remove blocks that are unreachable from entry
	for(VmBlock *curr = function->firstBlock->nextSibling; curr;)
	{
		VmBlock *next = curr->nextSibling;

		if(!curr->visited)
		{
			while(!curr->users.empty())
			{
				VmInstruction *inst = getType<VmInstruction>(curr->users.back());

				if(inst->cmd == VM_INST_JUMP)
				{
					inst->parent->RemoveInstruction(inst);
				}
				else if(inst->cmd == VM_INST_JUMP_NZ || inst->cmd == VM_INST_JUMP_Z)
				{
					if(inst->arguments[1] == curr)
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[2], NULL, NULL, NULL, NULL, NULL);
					else
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[1], NULL, NULL, NULL, NULL, NULL);
				}
				else if(inst->cmd == VM_INST_PHI)
				{
					for(unsigned i = 0; i < inst->arguments.size(); i += 2)
					{
						VmValue *option = inst->arguments[i];
						VmValue *edge = inst->arguments[i + 1];

						if(edge == curr)
						{
							option->RemoveUse(inst);
							edge->RemoveUse(inst);

							inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
							inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

							inst->arguments.pop_back();
							inst->arguments.pop_back();

							break;
						}
					}
				}
			}
		}

		curr = next;
	}

	VmBlock *curr = function->firstBlock;

	while(curr)
	{
		VmBlock *next = curr->nextSibling;
		RunDeadCodeElimiation(ctx, module, curr);
		curr = next;
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// Check that only reachable blocks remain
		assert(curr->visited);

		curr->visited = false;
	}
}